

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int find_jump_target(JSFunctionDef *s,int label,int *pop,int *pline)

{
  byte bVar1;
  LabelSlot *pLVar2;
  uint8_t *puVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  
  pLVar2 = s->label_slots;
  pLVar2[label].ref_count = pLVar2[label].ref_count + -1;
  puVar3 = (s->byte_code).buf;
  iVar6 = 0;
LAB_0015e63c:
  lVar5 = (long)label;
  iVar4 = pLVar2[lVar5].pos2;
  do {
    bVar1 = puVar3[iVar4];
    uVar7 = (uint)bVar1;
    if (bVar1 < 0xc0) {
      if (bVar1 != 0xb4) goto LAB_0015e683;
    }
    else {
      if (bVar1 != 0xc0) goto LAB_0015e6d0;
      if (pline != (int *)0x0) {
        *pline = *(int *)(puVar3 + (long)iVar4 + 1);
      }
    }
    iVar4 = iVar4 + (uint)opcode_info[bVar1].size;
  } while( true );
code_r0x0015e69d:
  lVar5 = (long)label;
  uVar7 = 0x6b;
  goto LAB_0015e6d0;
LAB_0015e683:
  if (bVar1 != 0xe) {
    if (bVar1 != 0x6b) goto LAB_0015e6d0;
    label = *(int *)(puVar3 + (long)iVar4 + 1);
    iVar6 = iVar6 + 1;
    if (iVar6 == 10) goto code_r0x0015e69d;
    goto LAB_0015e63c;
  }
  puVar3 = puVar3 + iVar4;
  do {
    puVar3 = puVar3 + 1;
  } while (*puVar3 == '\x0e');
  if (*puVar3 == ')') {
    uVar7 = 0x29;
  }
  else {
    uVar7 = 0xe;
  }
LAB_0015e6d0:
  *pop = uVar7;
  pLVar2[lVar5].ref_count = pLVar2[lVar5].ref_count + 1;
  return label;
}

Assistant:

static int find_jump_target(JSFunctionDef *s, int label, int *pop, int *pline)
{
    int i, pos, op;

    update_label(s, label, -1);
    for (i = 0; i < 10; i++) {
        assert(label >= 0 && label < s->label_count);
        pos = s->label_slots[label].pos2;
        for (;;) {
            switch(op = s->byte_code.buf[pos]) {
            case OP_line_num:
                if (pline)
                    *pline = get_u32(s->byte_code.buf + pos + 1);
                /* fall thru */
            case OP_label:
                pos += opcode_info[op].size;
                continue;
            case OP_goto:
                label = get_u32(s->byte_code.buf + pos + 1);
                break;
            case OP_drop:
                /* ignore drop opcodes if followed by OP_return_undef */
                while (s->byte_code.buf[++pos] == OP_drop)
                    continue;
                if (s->byte_code.buf[pos] == OP_return_undef)
                    op = OP_return_undef;
                /* fall thru */
            default:
                goto done;
            }
            break;
        }
    }
    /* cycle detected, could issue a warning */
 done:
    *pop = op;
    update_label(s, label, +1);
    return label;
}